

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::reset
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this)

{
  size_type sVar1;
  
  while( true ) {
    sVar1 = std::
            stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
            ::size((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                    *)0x2157b1);
    if (sVar1 < 2) break;
    std::
    stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)0x2157c5);
  }
  return;
}

Assistant:

void reset() {
        while (parsingStack.size() > 1) {
            parsingStack.pop();
        }
    }